

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O0

void __thiscall HMISong::ProcessInitialMetaEvents(HMISong *this)

{
  BYTE BVar1;
  DWORD DVar2;
  TrackInfo *pTVar3;
  bool bVar4;
  DWORD len;
  BYTE event;
  int i;
  TrackInfo *track;
  HMISong *this_local;
  
  for (len = 0; (int)len < this->NumTracks; len = len + 1) {
    pTVar3 = this->Tracks + (int)len;
    while( true ) {
      bVar4 = false;
      if ((((pTVar3->Finished & 1U) == 0) && (bVar4 = false, pTVar3->TrackP < pTVar3->MaxTrackP - 4)
          ) && (bVar4 = false, pTVar3->TrackBegin[pTVar3->TrackP] == '\0')) {
        bVar4 = pTVar3->TrackBegin[pTVar3->TrackP + 1] == 0xff;
      }
      if (!bVar4) break;
      BVar1 = pTVar3->TrackBegin[pTVar3->TrackP + 2];
      pTVar3->TrackP = pTVar3->TrackP + 3;
      DVar2 = (*this->ReadVarLen)(pTVar3);
      if (pTVar3->TrackP + (ulong)DVar2 <= pTVar3->MaxTrackP) {
        if (BVar1 == '/') {
          pTVar3->Finished = true;
        }
        else if (BVar1 == 'Q') {
          MIDIStreamer::SetTempo
                    (&this->super_MIDIStreamer,
                     (uint)pTVar3->TrackBegin[pTVar3->TrackP] << 0x10 |
                     (uint)pTVar3->TrackBegin[pTVar3->TrackP + 1] << 8 |
                     (uint)pTVar3->TrackBegin[pTVar3->TrackP + 2]);
        }
      }
      pTVar3->TrackP = (ulong)DVar2 + pTVar3->TrackP;
    }
    if (pTVar3->MaxTrackP - 4 <= pTVar3->TrackP) {
      pTVar3->Finished = true;
    }
  }
  return;
}

Assistant:

void HMISong::ProcessInitialMetaEvents ()
{
	TrackInfo *track;
	int i;
	BYTE event;
	DWORD len;

	for (i = 0; i < NumTracks; ++i)
	{
		track = &Tracks[i];
		while (!track->Finished &&
				track->TrackP < track->MaxTrackP - 4 &&
				track->TrackBegin[track->TrackP] == 0 &&
				track->TrackBegin[track->TrackP+1] == 0xFF)
		{
			event = track->TrackBegin[track->TrackP+2];
			track->TrackP += 3;
			len = ReadVarLen(track);
			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					SetTempo(
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2])
					);
					break;
				}
			}
			track->TrackP += len;
		}
		if (track->TrackP >= track->MaxTrackP - 4)
		{
			track->Finished = true;
		}
	}
}